

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O0

QDBusArgument * operator<<(QDBusArgument *arg,QList<QDBusMenuEvent> *list)

{
  bool bVar1;
  const_iterator o;
  QDBusArgument *in_RDI;
  long in_FS_OFFSET;
  const_iterator end;
  const_iterator it;
  QDBusMenuEvent *in_stack_ffffffffffffffa8;
  QList<QDBusMenuEvent> *in_stack_ffffffffffffffb0;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QMetaType::fromType<QDBusMenuEvent>();
  QDBusArgument::beginArray((QMetaType *)in_RDI);
  local_10.i = (QDBusMenuEvent *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QDBusMenuEvent>::begin(in_stack_ffffffffffffffb0);
  o = QList<QDBusMenuEvent>::end(in_stack_ffffffffffffffb0);
  while( true ) {
    bVar1 = QList<QDBusMenuEvent>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    QList<QDBusMenuEvent>::const_iterator::operator*(&local_10);
    operator<<((QDBusArgument *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    QList<QDBusMenuEvent>::const_iterator::operator++(&local_10);
  }
  QDBusArgument::endArray();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QDBusArgument &operator<<(QDBusArgument &arg, const Container<T> &list)
{
    arg.beginArray(QMetaType::fromType<T>());
    typename Container<T>::const_iterator it = list.begin();
    typename Container<T>::const_iterator end = list.end();
    for ( ; it != end; ++it)
        arg << *it;
    arg.endArray();
    return arg;
}